

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O0

int Dch_DeriveChoiceCountReprs(Aig_Man_t *pAig)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar2;
  int local_28;
  int local_24;
  int nReprs;
  int i;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAig_local;
  
  local_28 = 0;
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(pAig->vObjs);
    if (iVar1 <= local_24) {
      return local_28;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_24);
    if ((pObj_00 != (Aig_Obj_t *)0x0) &&
       (pAVar2 = Aig_ObjRepr(pAig,pObj_00), pAVar2 != (Aig_Obj_t *)0x0)) {
      if (pObj_00->Id <= pAVar2->Id) {
        __assert_fail("pRepr->Id < pObj->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchChoice.c"
                      ,0x54,"int Dch_DeriveChoiceCountReprs(Aig_Man_t *)");
      }
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int Dch_DeriveChoiceCountReprs( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj, * pRepr;
    int i, nReprs = 0;
    Aig_ManForEachObj( pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr( pAig, pObj );
        if ( pRepr == NULL )
            continue;
        assert( pRepr->Id < pObj->Id );
        nReprs++;
    }
    return nReprs;
}